

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZReadGIDGrid.cpp
# Opt level: O1

void __thiscall TPZReadGIDGrid::TPZReadGIDGrid(TPZReadGIDGrid *this)

{
  TPZManVector<MaterialDataV,_10>::TPZManVector
            (&(this->fMaterialDataVec).super_TPZManVector<MaterialDataV,_10>,0);
  (this->fMaterialDataVec).super_TPZManVector<MaterialDataV,_10>.super_TPZVec<MaterialDataV>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01a086f8;
  TPZManVector<MaterialDataV,_10>::TPZManVector
            (&(this->fBCMaterialDataVec).super_TPZManVector<MaterialDataV,_10>,0);
  (this->fBCMaterialDataVec).super_TPZManVector<MaterialDataV,_10>.super_TPZVec<MaterialDataV>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01a086f8;
  TPZManVector<MaterialDataV,_10>::TPZManVector
            (&(this->fBCNodeDataVec).super_TPZManVector<MaterialDataV,_10>,0);
  (this->fBCNodeDataVec).super_TPZManVector<MaterialDataV,_10>.super_TPZVec<MaterialDataV>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01a086f8;
  this->MatNumber = 0;
  this->BCNumber = 0;
  this->fProblemDimension = 0;
  this->fDimensionlessL = 1.0;
  return;
}

Assistant:

TPZReadGIDGrid::TPZReadGIDGrid() {
	MatNumber = 0;
	BCNumber = 0;
	fProblemDimension = 0;
	fDimensionlessL = 1.0;
}